

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

void Gia_Iso3Init(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int v;
  uint uVar4;
  
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pGVar2;
    uVar3 = (uint)uVar1;
    if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar3 < 0) {
      uVar4 = 0xf2db64f8;
      if ((~uVar3 & 0x9fffffff) != 0) {
        uVar4 = 0xdebbdff0;
        if ((int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
          uVar4 = 0xde3126bb;
        }
        if (-1 < (int)uVar3) {
          uVar4 = 0xdebbdff0;
        }
      }
    }
    else {
      uVar4 = *(uint *)((long)Iso_Nodes +
                       (ulong)((((uint)(uVar1 >> 0x1d) & 1) + (uint)((uVar1 >> 0x3d & 1) != 0)) * 4)
                       );
    }
    pGVar2->Value = uVar4;
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_Iso3Init( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_Iso3Node( pObj );
}